

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

void ImGui::SetTabItemClosed(char *label)

{
  ImGuiTabBar *tab_bar;
  ImGuiDockNode *pIVar1;
  ImU32 IVar2;
  ImGuiWindow *pIVar3;
  
  tab_bar = GImGui->CurrentTabBar;
  if ((tab_bar != (ImGuiTabBar *)0x0) && (((uint)tab_bar->Flags >> 0x14 & 1) == 0)) {
    IVar2 = TabBarCalcTabID((ImGuiTabBar *)(ulong)(uint)tab_bar->Flags,label);
    TabBarRemoveTab(tab_bar,IVar2);
    return;
  }
  pIVar3 = FindWindowByName(label);
  if ((pIVar3 != (ImGuiWindow *)0x0) &&
     (((pIVar3->field_0x43a & 1) != 0 && (pIVar1 = pIVar3->DockNode, pIVar1 != (ImGuiDockNode *)0x0)
      ))) {
    IVar2 = TabBarCalcTabID((ImGuiTabBar *)(ulong)(uint)pIVar1->TabBar->Flags,label);
    TabBarRemoveTab(pIVar1->TabBar,IVar2);
    pIVar3->field_0x43a = pIVar3->field_0x43a | 4;
  }
  return;
}

Assistant:

void    ImGui::SetTabItemClosed(const char* label)
{
    ImGuiContext& g = *GImGui;
    bool is_within_manual_tab_bar = g.CurrentTabBar && !(g.CurrentTabBar->Flags & ImGuiTabBarFlags_DockNode);
    if (is_within_manual_tab_bar)
    {
        ImGuiTabBar* tab_bar = g.CurrentTabBar;
        IM_ASSERT(tab_bar->WantLayout);         // Needs to be called AFTER BeginTabBar() and BEFORE the first call to BeginTabItem()
        ImGuiID tab_id = TabBarCalcTabID(tab_bar, label);
        TabBarRemoveTab(tab_bar, tab_id);
    }
    else if (ImGuiWindow* window = FindWindowByName(label))
    {
        if (window->DockIsActive)
            if (ImGuiDockNode* node = window->DockNode)
            {
                ImGuiID tab_id = TabBarCalcTabID(node->TabBar, label);
                TabBarRemoveTab(node->TabBar, tab_id);
                window->DockTabWantClose = true;
            }
    }
}